

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewSampling::initPerSampleFillerProgramObject
          (TextureViewTestViewSampling *this)

{
  char *__s;
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ulong uVar6;
  string *psVar7;
  TestError *pTVar8;
  int local_230;
  uint local_22c;
  GLint link_status;
  GLuint so_id;
  GLint compile_status;
  uint n_so_id;
  uint n_so_ids;
  GLuint so_ids [3];
  size_t token_location;
  char *n_max_samples_token;
  stringstream n_max_samples_sstream;
  undefined1 local_1d0 [376];
  undefined8 local_58;
  char *fs_body_string_raw_ptr;
  allocator<char> local_39;
  string local_38 [8];
  string fs_body_string;
  Functions *gl;
  TextureViewTestViewSampling *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  fs_body_string.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(fs_body_string.field_2._8_8_ + 0x3f0))(0x8b30);
  this->m_per_sample_filler_fs_id = GVar2;
  GVar2 = (**(code **)(fs_body_string.field_2._8_8_ + 0x3f0))(0x8dd9);
  this->m_per_sample_filler_gs_id = GVar2;
  GVar2 = (**(code **)(fs_body_string.field_2._8_8_ + 0x3f0))(0x8b31);
  this->m_per_sample_filler_vs_id = GVar2;
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1660);
  GVar2 = (**(code **)(fs_body_string.field_2._8_8_ + 0x3c8))();
  this->m_per_sample_filler_po_id = GVar2;
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1663);
  __s = initPerSampleFillerProgramObject::fs_body;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_58 = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&n_max_samples_token);
  std::ostream::operator<<(local_1d0,this->m_max_color_texture_samples_gl_value);
  while( true ) {
    uVar6 = std::__cxx11::string::find((char *)local_38,0x2a51fe4);
    if (uVar6 == 0xffffffffffffffff) break;
    psVar7 = (string *)strlen("N_MAX_SAMPLES");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_38,uVar6,psVar7);
    std::__cxx11::string::~string((string *)(so_ids + 1));
  }
  local_58 = std::__cxx11::string::c_str();
  (**(code **)(fs_body_string.field_2._8_8_ + 0x12b8))
            (this->m_per_sample_filler_fs_id,1,&local_58,0);
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1680);
  (**(code **)(fs_body_string.field_2._8_8_ + 0x12b8))
            (this->m_per_sample_filler_gs_id,1,&initPerSampleFillerProgramObject::gs_body,0);
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16a1);
  (**(code **)(fs_body_string.field_2._8_8_ + 0x12b8))
            (this->m_per_sample_filler_vs_id,1,&initPerSampleFillerProgramObject::vs_body,0);
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16ac);
  (**(code **)(fs_body_string.field_2._8_8_ + 0x10))
            (this->m_per_sample_filler_po_id,this->m_per_sample_filler_fs_id);
  (**(code **)(fs_body_string.field_2._8_8_ + 0x10))
            (this->m_per_sample_filler_po_id,this->m_per_sample_filler_gs_id);
  (**(code **)(fs_body_string.field_2._8_8_ + 0x10))
            (this->m_per_sample_filler_po_id,this->m_per_sample_filler_vs_id);
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16b2);
  n_so_id = this->m_per_sample_filler_fs_id;
  n_so_ids = this->m_per_sample_filler_gs_id;
  so_ids[0] = this->m_per_sample_filler_vs_id;
  compile_status = 3;
  for (so_id = 0; so_id < 3; so_id = so_id + 1) {
    link_status = 0;
    local_22c = (&n_so_id)[so_id];
    (**(code **)(fs_body_string.field_2._8_8_ + 0x248))(local_22c);
    dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x16be);
    (**(code **)(fs_body_string.field_2._8_8_ + 0xa70))(local_22c,0x8b81,&link_status);
    dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glGetShaderiV() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x16c1);
    if (link_status != 1) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Shader compilation failed.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x16c5);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  local_230 = 0;
  (**(code **)(fs_body_string.field_2._8_8_ + 0xce8))(this->m_per_sample_filler_po_id);
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16cd);
  (**(code **)(fs_body_string.field_2._8_8_ + 0x9d8))
            (this->m_per_sample_filler_po_id,0x8b82,&local_230);
  dVar3 = (**(code **)(fs_body_string.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16d0);
  if (local_230 != 1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Program linking failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x16d4);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar4 = (**(code **)(fs_body_string.field_2._8_8_ + 0xb48))
                    (this->m_per_sample_filler_po_id,"layer_id");
  this->m_per_sample_filler_po_layer_id_location = GVar4;
  GVar4 = (**(code **)(fs_body_string.field_2._8_8_ + 0xb48))
                    (this->m_per_sample_filler_po_id,"reference_colors[0]");
  this->m_per_sample_filler_po_reference_colors_location = GVar4;
  if (this->m_per_sample_filler_po_layer_id_location == -1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"layer_id uniform is considered inactive which is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x16de);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (this->m_per_sample_filler_po_reference_colors_location == -1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"reference_colors uniform is considered inactive which is invalid",(char *)0x0
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x16e3);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&n_max_samples_token);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void TextureViewTestViewSampling::initPerSampleFillerProgramObject()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Sanity checks: GL_MAX_COLOR_TEXTURE_SAMPLES is not 0 */
	DE_ASSERT(m_max_color_texture_samples_gl_value != 0);

	/* Generate program and shader objects */
	m_per_sample_filler_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_per_sample_filler_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_per_sample_filler_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	m_per_sample_filler_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Configure fragment shader's body */
	static const char* fs_body = "#version 400\n"
								 "\n"
								 "uniform vec4 reference_colors[N_MAX_SAMPLES];\n"
								 "\n"
								 "out vec4 result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    result = reference_colors[gl_SampleID];\n"
								 "}\n";
	std::string		  fs_body_string		 = fs_body;
	const char*		  fs_body_string_raw_ptr = DE_NULL;
	std::stringstream n_max_samples_sstream;
	const char*		  n_max_samples_token = "N_MAX_SAMPLES";
	std::size_t		  token_location	  = std::string::npos;

	n_max_samples_sstream << m_max_color_texture_samples_gl_value;

	while ((token_location = fs_body_string.find(n_max_samples_token)) != std::string::npos)
	{
		fs_body_string.replace(token_location, strlen(n_max_samples_token), n_max_samples_sstream.str());
	}

	fs_body_string_raw_ptr = fs_body_string.c_str();

	gl.shaderSource(m_per_sample_filler_fs_id, 1 /* count */, &fs_body_string_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Configure geometry shader's body */
	static const char* gs_body = "#version 400\n"
								 "\n"
								 "layout(points)                           in;\n"
								 "layout(triangle_strip, max_vertices = 4) out;\n"
								 "\n"
								 "uniform int layer_id;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4( 1.0, -1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4( 1.0,  1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    EndPrimitive();\n"
								 "\n"
								 "}\n";

	gl.shaderSource(m_per_sample_filler_gs_id, 1 /* count */, &gs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Configure vertex shader */
	static const char* vs_body = "#version 400\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
								 "}\n";

	gl.shaderSource(m_per_sample_filler_vs_id, 1 /* count */, &vs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Attach the shaders to the program object */
	gl.attachShader(m_per_sample_filler_po_id, m_per_sample_filler_fs_id);
	gl.attachShader(m_per_sample_filler_po_id, m_per_sample_filler_gs_id);
	gl.attachShader(m_per_sample_filler_po_id, m_per_sample_filler_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	/* Compile the shaders */
	const glw::GLuint  so_ids[] = { m_per_sample_filler_fs_id, m_per_sample_filler_gs_id, m_per_sample_filler_vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLint  compile_status = GL_FALSE;
		glw::GLuint so_id		   = so_ids[n_so_id];

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiV() call failed.");

		if (compile_status != GL_TRUE)
		{
			TCU_FAIL("Shader compilation failed.");
		}
	} /* for (all shader objects) */

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_per_sample_filler_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_per_sample_filler_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Retrieve uniform locations */
	m_per_sample_filler_po_layer_id_location = gl.getUniformLocation(m_per_sample_filler_po_id, "layer_id");
	m_per_sample_filler_po_reference_colors_location =
		gl.getUniformLocation(m_per_sample_filler_po_id, "reference_colors[0]");

	if (m_per_sample_filler_po_layer_id_location == -1)
	{
		TCU_FAIL("layer_id uniform is considered inactive which is invalid");
	}

	if (m_per_sample_filler_po_reference_colors_location == -1)
	{
		TCU_FAIL("reference_colors uniform is considered inactive which is invalid");
	}
}